

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::scanStruct(Parser *this,ScannedTopLevelItem *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Module *pMVar2;
  iterator __position;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view name_00;
  string name;
  string local_98;
  string local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [40];
  
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_98,this);
  pMVar2 = (this->module).object;
  if (pMVar2 == (Module *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  name_00._M_len = &pMVar2->structs;
  name_00._M_str = (char *)local_98._M_string_length;
  Module::Structs::find((Structs *)local_58,name_00);
  uVar3 = local_58._0_8_;
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_58._0_8_);
  if ((Structure *)uVar3 != (Structure *)0x0) {
    CompileMessageHelpers::createMessage<std::__cxx11::string&>
              ((CompileMessage *)local_58,(CompileMessageHelpers *)0x1,none,0x27b770,
               (char *)&local_98,in_R9);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_48._16_8_);
    if ((Structure *)local_58._0_8_ != (Structure *)local_48) {
      operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
    }
  }
  pMVar2 = (this->module).object;
  if (pMVar2 != (Module *)0x0) {
    paVar1 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) {
      local_78.field_2._8_8_ = local_98.field_2._8_8_;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
    }
    local_78.field_2._M_allocated_capacity._1_7_ = local_98.field_2._M_allocated_capacity._1_7_;
    local_78.field_2._M_local_buf[0] = local_98.field_2._M_local_buf[0];
    local_78._M_string_length = local_98._M_string_length;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)paVar1;
    Module::Structs::add(&pMVar2->structs,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x259fad);
    local_58._0_8_ =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    __position._M_current =
         (item->structBodyCode).
         super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (item->structBodyCode).
        super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
      _M_realloc_insert<soul::UTF8Reader>(&item->structBodyCode,__position,(UTF8Reader *)local_58);
    }
    else {
      (__position._M_current)->data = (char *)local_58._0_8_;
      (item->structBodyCode).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    skipPastNextOccurrenceOf(this,(TokenType)0x258ac2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void scanStruct (ScannedTopLevelItem& item)
    {
        auto name = readQualifiedGeneralIdentifier();

        if (module->structs.find (name) != nullptr)
            throwError (Errors::nameInUse (name));

        module->structs.add (std::move (name));
        expect (HEARTOperator::openBrace);
        item.structBodyCode.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
    }